

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_b20dc::ParserImpl::ParseExp
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *left,TokenDetail op,
          int left_priority)

{
  GCObject *pGVar1;
  long lVar2;
  String *pSVar3;
  char *pcVar4;
  undefined8 uVar5;
  SyntaxTree *pSVar6;
  undefined8 uVar7;
  TokenDetail op_00;
  int iVar8;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar9;
  TokenDetail *pTVar10;
  ParseException *this_00;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar11;
  TokenDetail *pTVar12;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> _Var13;
  int in_ECX;
  undefined4 in_register_00000014;
  long *plVar14;
  int iVar15;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_80;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_78;
  _Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_> local_70;
  long *local_68;
  long *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  plVar14 = (long *)CONCAT44(in_register_00000014,left_priority);
  pTVar12 = (TokenDetail *)(left + 5);
  iVar8 = *(int *)&left[8]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (iVar8 == 0x11e) {
    luna::Lexer::GetToken
              ((Lexer *)(left->_M_t).
                        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                        .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar12);
    iVar8 = *(int *)&left[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  local_70.super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl =
       (_Head_base<0UL,_luna::SyntaxTree_*,_false>)(_Head_base<0UL,_luna::SyntaxTree_*,_false>)this;
  if (iVar8 < 0x7b) {
    if (iVar8 != 0x23) {
      if (iVar8 == 0x28) goto switchD_001508a5_caseD_115;
      if (iVar8 != 0x2d) goto switchD_001508a5_caseD_107;
    }
switchD_001508a5_caseD_10d:
    NextToken((ParserImpl *)left);
    aVar9.str_ = (String *)operator_new(0x30);
    ((aVar9.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__UnaryExpression_00188288;
    ((aVar9.str_)->super_GCObject).next_ = (GCObject *)0x0;
    pSVar6 = left[2]._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    uVar5 = *(undefined8 *)
             ((long)&left[2]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
    uVar7 = *(undefined8 *)
             ((long)&left[3]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
    *(SyntaxTree **)&((aVar9.str_)->super_GCObject).field_0x10 =
         left[1]._M_t.
         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    ((aVar9.str_)->field_1).str_ = (char *)pSVar6;
    *(undefined8 *)((long)&(aVar9.str_)->field_1 + 4) = uVar5;
    *(undefined8 *)((long)&(aVar9.str_)->field_1 + 0xc) = uVar7;
    local_60 = (long *)0x0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0x11e;
    op_00._28_4_ = uStack_3c;
    op_00.token_ = 0x11e;
    op_00.line_ = 0;
    op_00.column_ = 0;
    op_00.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op_00.module_ = (String *)0x0;
    ParseExp((ParserImpl *)&local_80,left,op_00,(int)&local_60);
    pGVar1 = ((aVar9.str_)->super_GCObject).next_;
    ((aVar9.str_)->super_GCObject).next_ = (GCObject *)local_80;
    if (pGVar1 != (GCObject *)0x0) {
      (*pGVar1->_vptr_GCObject[1])();
    }
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
    local_60 = (long *)0x0;
  }
  else {
    switch(iVar8) {
    case 0x107:
    case 0x109:
    case 0x10a:
    case 0x10b:
    case 0x10e:
    case 0x10f:
    case 0x110:
    case 0x111:
    case 0x113:
    case 0x114:
switchD_001508a5_caseD_107:
      this_00 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(this_00,"unexpect token for exp.",pTVar12);
      __cxa_throw(this_00,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    case 0x108:
      NextToken((ParserImpl *)left);
      if (*(int *)&left[4]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x108) {
        __assert_fail("current_.token_ == Token_Function",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x7e,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseFunctionDef()"
                     );
      }
      ParseFunctionBody((ParserImpl *)&local_80);
      aVar9 = local_80;
      break;
    case 0x10d:
      goto switchD_001508a5_caseD_10d;
    case 0x115:
switchD_001508a5_caseD_115:
      ParsePrefixExp((ParserImpl *)&local_80,(PrefixExpType *)left);
      aVar9 = local_80;
      break;
    default:
      if (iVar8 == 0x7b) {
        ParseTableConstructor((ParserImpl *)&local_80);
        aVar9 = local_80;
        break;
      }
      if (iVar8 != 0x11d) goto switchD_001508a5_caseD_107;
    case 0x106:
    case 0x10c:
    case 0x112:
    case 0x116:
    case 0x117:
      aVar9.str_ = (String *)operator_new(0x30);
      pTVar10 = NextToken((ParserImpl *)left);
      ((aVar9.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__SyntaxTree_00188208;
      pSVar3 = pTVar10->module_;
      pcVar4 = *(char **)&pTVar10->line_;
      uVar5 = *(undefined8 *)&pTVar10->token_;
      ((aVar9.str_)->super_GCObject).next_ = (GCObject *)pTVar10->field_0;
      *(String **)&((aVar9.str_)->super_GCObject).field_0x10 = pSVar3;
      ((aVar9.str_)->field_1).str_ = pcVar4;
      *(undefined8 *)((long)&(aVar9.str_)->field_1 + 8) = uVar5;
      *(undefined8 *)&(aVar9.str_)->length_ = 0;
    }
  }
  do {
    iVar8 = *(int *)&left[8]._M_t.
                     super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                     .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    if (iVar8 == 0x11e) {
      luna::Lexer::GetToken
                ((Lexer *)(left->_M_t).
                          super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                          .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar12);
      iVar8 = *(int *)&left[8]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    }
    if (iVar8 < 0x100) {
      if (iVar8 < 0x2f) {
        if (iVar8 < 0x2b) {
          if ((iVar8 == 0x25) || (iVar8 == 0x2a)) {
LAB_00150b1b:
            iVar15 = 0x50;
            goto LAB_00150b70;
          }
        }
        else if ((iVar8 == 0x2b) || (iVar8 == 0x2d)) {
          iVar15 = 0x46;
          goto LAB_00150b70;
        }
      }
      else if (iVar8 < 0x3e) {
        if (iVar8 == 0x2f) goto LAB_00150b1b;
        if (iVar8 == 0x3c) goto LAB_00150b03;
      }
      else {
        if (iVar8 == 0x3e) {
LAB_00150b03:
          iVar15 = 0x32;
          goto LAB_00150b70;
        }
        iVar15 = 100;
        if (iVar8 == 0x5e) goto LAB_00150b70;
      }
LAB_00150b67:
      iVar15 = 0;
    }
    else if (iVar8 < 0x118) {
      if (iVar8 == 0x100) {
        iVar15 = 0x28;
      }
      else {
        if (iVar8 != 0x10e) goto LAB_00150b67;
        iVar15 = 0x1e;
      }
    }
    else {
      if (iVar8 - 0x118U < 4) goto LAB_00150b03;
      if (iVar8 != 0x11c) goto LAB_00150b67;
      iVar15 = 0x3c;
    }
LAB_00150b70:
    if (iVar15 == in_ECX || iVar15 < in_ECX) {
      if (iVar15 != in_ECX) {
        pGVar1 = (GCObject *)*plVar14;
        if (pGVar1 != (GCObject *)0x0) {
          aVar11.str_ = (String *)operator_new(0x38);
          *plVar14 = 0;
          ((aVar11.str_)->super_GCObject)._vptr_GCObject =
               (_func_int **)&PTR__BinaryExpression_00188248;
          ((aVar11.str_)->super_GCObject).next_ = pGVar1;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((aVar11.str_)->super_GCObject).field_0x10
               = (String *)aVar9;
          ((aVar11.str_)->field_1).str_ = (char *)op.field_0;
          *(String **)((long)&(aVar11.str_)->field_1 + 8) = op.module_;
          *(int *)((long)aVar11 + 0x28) = op.line_;
          *(int *)((long)aVar11 + 0x2c) = op.column_;
          (aVar11.str_)->hash_ = op._24_8_;
          aVar9.str_ = aVar11.str_;
        }
        goto LAB_00150c65;
      }
      if (iVar8 == 0x11e) {
        luna::Lexer::GetToken
                  ((Lexer *)(left->_M_t).
                            super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                            .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,pTVar12);
        iVar8 = *(int *)&left[8]._M_t.
                         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                         .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      }
      if (iVar8 != 0x5e) {
        if (in_ECX == 0) {
LAB_00150c65:
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           local_70.super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl = aVar9;
          _Var13._M_head_impl =
               (SyntaxTree *)local_70.super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        }
        else {
          lVar2 = *plVar14;
          if (lVar2 == 0) {
            __assert_fail("left",
                          "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                          ,0x49,
                          "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseExp(std::unique_ptr<SyntaxTree>, TokenDetail, int)"
                         );
          }
          local_68 = (long *)operator_new(0x38);
          *plVar14 = 0;
          *local_68 = (long)&PTR__BinaryExpression_00188248;
          local_68[1] = lVar2;
          ((anon_union_8_2_010d16d7_for_TokenDetail_0 *)(local_68 + 2))->str_ = (String *)aVar9;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)(local_68 + 3) = op.field_0;
          local_68[4] = (long)op.module_;
          local_68[5] = op._16_8_;
          local_68[6] = op._24_8_;
          pTVar12 = NextToken((ParserImpl *)left);
          _Var13._M_head_impl =
               (SyntaxTree *)
               ParseExp((ParserImpl *)
                        local_70.super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,left,
                        *pTVar12,(int)&local_68);
          if (local_68 != (long *)0x0) {
            _Var13._M_head_impl = (SyntaxTree *)(**(code **)(*local_68 + 8))();
          }
        }
        return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)
               _Var13._M_head_impl;
      }
    }
    local_78 = aVar9;
    pTVar10 = NextToken((ParserImpl *)left);
    ParseExp((ParserImpl *)&local_80,left,*pTVar10,(int)&local_78);
    aVar9 = local_80;
    if (local_78.str_ != (String *)0x0) {
      (*((local_78.str_)->super_GCObject)._vptr_GCObject[1])();
    }
    local_78.number_ = 0.0;
  } while( true );
}

Assistant:

std::unique_ptr<SyntaxTree> ParseExp(std::unique_ptr<SyntaxTree> left = std::unique_ptr<SyntaxTree>(),
                                             TokenDetail op = TokenDetail(),
                                             int left_priority = 0)
        {
            std::unique_ptr<SyntaxTree> exp;
            LookAhead();

            if (look_ahead_.token_ == '-' || look_ahead_.token_ == '#' || look_ahead_.token_ == Token_Not)
            {
                NextToken();
                std::unique_ptr<UnaryExpression> unexp(new UnaryExpression);
                unexp->op_token_ = current_;
                unexp->exp_ = ParseExp(std::unique_ptr<SyntaxTree>(), TokenDetail(), 90);
                exp = std::move(unexp);
            }
            else if (IsMainExp(look_ahead_))
                exp = ParseMainExp();
            else
                throw ParseException("unexpect token for exp.", look_ahead_);

            while (true)
            {
                int right_priority = GetOpPriority(LookAhead());
                if (left_priority < right_priority ||
                    (left_priority == right_priority && IsRightAssociation(LookAhead())))
                {
                    exp = ParseExp(std::move(exp), NextToken(), right_priority);
                }
                else if (left_priority == right_priority)
                {
                    if (left_priority == 0)
                        return exp;
                    assert(left);
                    exp = std::unique_ptr<BinaryExpression>(
                        new BinaryExpression(std::move(left), std::move(exp), op));
                    return ParseExp(std::move(exp), NextToken(), right_priority);
                }
                else
                {
                    if (left)
                        exp = std::unique_ptr<BinaryExpression>(
                            new BinaryExpression(std::move(left), std::move(exp), op));
                    return exp;
                }
            }
        }